

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O1

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  cmExtraKateGenerator *this_01;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  std::__cxx11::string::string
            ((string *)&local_68,(this_00->ProjectName)._M_dataplus._M_p,&local_e9);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CMAKE_BUILD_TYPE","");
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_e8);
  std::__cxx11::string::string((string *)&local_88,pcVar2,&local_ea);
  this_01 = (cmExtraKateGenerator *)cmMakefile::GetHomeOutputDirectory(this_00);
  std::__cxx11::string::string((string *)&local_c8,(char *)this_01,&local_eb);
  GetPathBasename(&local_a8,this_01,&local_c8);
  GenerateProjectName(&local_48,this_01,&local_68,&local_88,&local_a8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])
            (&local_48);
  iVar1 = std::__cxx11::string::compare((char *)&local_48);
  this->UseNinja = iVar1 == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  CreateKateProjectFile(this,this_00);
  CreateDummyKateProjectFile(this,this_00);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  const cmMakefile* mf
     = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  this->ProjectName = this->GenerateProjectName(mf->GetProjectName(),
                          mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                          this->GetPathBasename(mf->GetHomeOutputDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(mf);
  this->CreateDummyKateProjectFile(mf);
}